

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream_hash_module.c
# Opt level: O1

char * ngx_http_upstream_hash(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  long *plVar2;
  int iVar3;
  ngx_int_t nVar4;
  code *pcVar5;
  char *pcVar6;
  undefined1 auStack_48 [8];
  ngx_http_compile_complex_value_t ccv;
  
  pvVar1 = cf->args->elts;
  ccv.complex_value = (ngx_http_complex_value_t *)0x0;
  ccv.cf = (ngx_conf_t *)((long)pvVar1 + 0x10);
  auStack_48 = (undefined1  [8])cf;
  ccv.value = (ngx_str_t *)conf;
  nVar4 = ngx_http_compile_complex_value((ngx_http_compile_complex_value_t *)auStack_48);
  pcVar6 = (char *)0xffffffffffffffff;
  if (nVar4 == 0) {
    plVar2 = *(long **)(*(long *)((long)cf->ctx + 8) + ngx_http_upstream_module.ctx_index * 8);
    if (*plVar2 != 0) {
      ngx_conf_log_error(5,cf,0,"load balancing method redefined");
    }
    plVar2[5] = 0x11f;
    if (cf->args->nelts == 2) {
      pcVar5 = ngx_http_upstream_init_hash;
    }
    else {
      iVar3 = strcmp(*(char **)((long)pvVar1 + 0x28),"consistent");
      if (iVar3 != 0) {
        ngx_conf_log_error(1,cf,0,"invalid parameter \"%V\"",(long)pvVar1 + 0x20);
        return (char *)0xffffffffffffffff;
      }
      pcVar5 = ngx_http_upstream_init_chash;
    }
    *plVar2 = (long)pcVar5;
    pcVar6 = (char *)0x0;
  }
  return pcVar6;
}

Assistant:

static char *
ngx_http_upstream_hash(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_upstream_hash_srv_conf_t  *hcf = conf;

    ngx_str_t                         *value;
    ngx_http_upstream_srv_conf_t      *uscf;
    ngx_http_compile_complex_value_t   ccv;

    value = cf->args->elts;

    ngx_memzero(&ccv, sizeof(ngx_http_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = &hcf->key;

    if (ngx_http_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    uscf = ngx_http_conf_get_module_srv_conf(cf, ngx_http_upstream_module);

    if (uscf->peer.init_upstream) {
        ngx_conf_log_error(NGX_LOG_WARN, cf, 0,
                           "load balancing method redefined");
    }

    uscf->flags = NGX_HTTP_UPSTREAM_CREATE
                  |NGX_HTTP_UPSTREAM_WEIGHT
                  |NGX_HTTP_UPSTREAM_MAX_CONNS
                  |NGX_HTTP_UPSTREAM_MAX_FAILS
                  |NGX_HTTP_UPSTREAM_FAIL_TIMEOUT
                  |NGX_HTTP_UPSTREAM_DOWN;

    if (cf->args->nelts == 2) {
        uscf->peer.init_upstream = ngx_http_upstream_init_hash;

    } else if (ngx_strcmp(value[2].data, "consistent") == 0) {
        uscf->peer.init_upstream = ngx_http_upstream_init_chash;

    } else {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid parameter \"%V\"", &value[2]);
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}